

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O3

Symbol concat(Symbol a,Symbol b)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  Symbol SVar4;
  
  uVar3 = a.icl >> 0x1c;
  uVar1 = (int)(b.icl >> 0x1c) + (int)uVar3;
  uVar2 = 8;
  if (uVar1 < 8) {
    uVar2 = uVar1;
  }
  SVar4.icl._0_4_ = uVar2 * 0xffffff8 + 0x1ff0040;
  SVar4.val = b.val.num << ((char)uVar3 * '\b' & 0x3fU) | a.val.num;
  SVar4.icl._4_4_ = 0;
  return SVar4;
}

Assistant:

Symbol concat(Symbol a, Symbol b) {
	Symbol s;
	u32 length = a.length()+b.length();
	if (length > Symbol::maxLength) length = Symbol::maxLength;
	s.set_code_len(FSST_CODE_MASK, length);
	s.val.num = (b.val.num << (8*a.length())) | a.val.num;
	return s;
}